

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

ctmbstr HTMLVersion(TidyDocImpl *doc)

{
  ctmbstr ptVar1;
  uint vers;
  
  vers = doc->lexer->versionEmitted;
  if (vers == 0) {
    vers = doc->lexer->doctype;
  }
  ptVar1 = prvTidyHTMLVersionNameFromCode(vers,no);
  if (ptVar1 != (ctmbstr)0x0) {
    return ptVar1;
  }
  ptVar1 = tidyLocalizedString(0x1fb);
  return ptVar1;
}

Assistant:

static ctmbstr HTMLVersion( TidyDocImpl* doc )
{
    uint versionEmitted = doc->lexer->versionEmitted;
    uint declared = doc->lexer->doctype;
    uint version = versionEmitted == 0 ? declared : versionEmitted;
    ctmbstr result = TY_(HTMLVersionNameFromCode)(version, 0);
    if (!result)
        result = tidyLocalizedString(STRING_HTML_PROPRIETARY);
    return result;
}